

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O3

int init(EVP_PKEY_CTX *ctx)

{
  char cVar1;
  UErrorCode UVar2;
  LocalPointerBase<UResourceBundle> LVar3;
  UBool UVar4;
  int iVar5;
  int32_t iVar6;
  uint uVar7;
  UVector *pUVar8;
  UResourceBundle *pUVar9;
  UChar *pUVar10;
  char *pcVar11;
  undefined8 *puVar12;
  char *__s;
  char *pcVar13;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  ulong extraout_RAX;
  char cVar17;
  char *pcVar18;
  code *pcVar19;
  UErrorCode sts;
  UErrorCode tmpSts;
  LocalUResourceBundlePointer typeAliasDataEntry;
  int32_t bcpKeyIdLen;
  int32_t bcpTypeIdLen;
  LocalUResourceBundlePointer typeMapEntry;
  LocalUResourceBundlePointer keyMapEntry;
  int32_t toLen;
  LocalUResourceBundlePointer typeMapResByKey;
  LocalUResourceBundlePointer keyTypeDataRes;
  LocalUResourceBundlePointer keyMapRes;
  LocalUResourceBundlePointer bcpTypeAliasRes;
  LocalUResourceBundlePointer typeAliasRes;
  LocalUResourceBundlePointer typeMapRes;
  UErrorCode local_c8;
  UErrorCode local_c4;
  LocalPointerBase<UResourceBundle> local_c0;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  LocalPointerBase<UResourceBundle> local_a8;
  LocalPointerBase<UResourceBundle> local_a0;
  char *local_98;
  LocalPointerBase<UResourceBundle> local_90;
  LocalPointerBase<UResourceBundle> local_88;
  int32_t local_7c;
  char *local_78;
  UHashtable *local_70;
  LocalPointerBase<UResourceBundle> local_68;
  LocalPointerBase<UResourceBundle> local_60;
  int local_54;
  LocalPointerBase<UResourceBundle> local_50;
  LocalUResourceBundlePointer local_48;
  LocalPointerBase<UResourceBundle> local_40;
  LocalPointerBase<UResourceBundle> local_38;
  
  local_c8 = U_ZERO_ERROR;
  if ((gLocExtKeyMapInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
     (UVar4 = icu_63::umtx_initImplPreInit(&gLocExtKeyMapInitOnce), UVar4 == '\0')) {
    uVar16 = (ulong)(uint)gLocExtKeyMapInitOnce.fErrCode;
    if (U_ZERO_ERROR < gLocExtKeyMapInitOnce.fErrCode) {
      local_c8 = gLocExtKeyMapInitOnce.fErrCode;
    }
    goto LAB_002d532f;
  }
  ucln_common_registerCleanup_63(UCLN_COMMON_LOCALE_KEY_TYPE,uloc_key_type_cleanup);
  gLocExtKeyMap =
       uhash_open_63(uhash_hashIChars_63,uhash_compareIChars_63,(undefined1 *)0x0,&local_c8);
  local_60.ptr = ures_openDirect_63((char *)0x0,"keyTypeData",&local_c8);
  local_50.ptr = ures_getByKey_63(local_60.ptr,"keyMap",(UResourceBundle *)0x0,&local_c8);
  local_38.ptr = ures_getByKey_63(local_60.ptr,"typeMap",(UResourceBundle *)0x0,&local_c8);
  if (local_c8 < U_ILLEGAL_ARGUMENT_ERROR) {
    local_c4 = U_ZERO_ERROR;
    local_40.ptr = ures_getByKey_63(local_60.ptr,"typeAlias",(UResourceBundle *)0x0,&local_c4);
    local_c4 = U_ZERO_ERROR;
    pcVar18 = "bcpTypeAlias";
    local_48.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)
         ures_getByKey_63(local_60.ptr,"bcpTypeAlias",(UResourceBundle *)0x0,&local_c4);
    pUVar8 = (UVector *)icu_63::UMemory::operator_new((UMemory *)0x28,(size_t)pcVar18);
    if (pUVar8 == (UVector *)0x0) {
      gKeyTypeStringPool = (UVector *)0x0;
LAB_002d52d2:
      if (local_c8 < U_ILLEGAL_ARGUMENT_ERROR) {
        local_c8 = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    else {
      pcVar19 = uloc_deleteKeyTypeStringPoolEntry;
      icu_63::UVector::UVector
                (pUVar8,uloc_deleteKeyTypeStringPoolEntry,(UElementsAreEqual *)0x0,&local_c8);
      gKeyTypeStringPool = pUVar8;
      if (local_c8 < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar8 = (UVector *)icu_63::UMemory::operator_new((UMemory *)0x28,(size_t)pcVar19);
        if (pUVar8 == (UVector *)0x0) {
          gLocExtKeyDataEntries = (UVector *)0x0;
          goto LAB_002d52d2;
        }
        pcVar19 = uloc_deleteKeyDataEntry;
        icu_63::UVector::UVector(pUVar8,uloc_deleteKeyDataEntry,(UElementsAreEqual *)0x0,&local_c8);
        gLocExtKeyDataEntries = pUVar8;
        if (local_c8 < U_ILLEGAL_ARGUMENT_ERROR) {
          pUVar8 = (UVector *)icu_63::UMemory::operator_new((UMemory *)0x28,(size_t)pcVar19);
          if (pUVar8 == (UVector *)0x0) {
            gLocExtTypeEntries = (UVector *)0x0;
            goto LAB_002d52d2;
          }
          icu_63::UVector::UVector(pUVar8,uloc_deleteTypeEntry,(UElementsAreEqual *)0x0,&local_c8);
          gLocExtTypeEntries = pUVar8;
          if (local_c8 < U_ILLEGAL_ARGUMENT_ERROR) {
            local_88.ptr = (UResourceBundle *)0x0;
            do {
              UVar4 = ures_hasNext_63(local_50.ptr);
              LVar3.ptr = local_88.ptr;
              if (UVar4 == '\0') break;
              local_88.ptr = (UResourceBundle *)0x0;
              pUVar9 = ures_getNextResource_63(local_50.ptr,LVar3.ptr,&local_c8);
              if (local_88.ptr != (UResourceBundle *)0x0) {
                ures_close_63(local_88.ptr);
              }
              local_88.ptr = pUVar9;
              if (U_ZERO_ERROR < local_c8) break;
              local_98 = ures_getKey_63(pUVar9);
              local_b4 = 0;
              pUVar10 = ures_getString_63(local_88.ptr,(int32_t *)&local_b4,&local_c8);
              if (U_ZERO_ERROR < local_c8) break;
              local_78 = local_98;
              if (0 < (int)local_b4) {
                pcVar18 = (char *)uprv_malloc_63((ulong)local_b4 + 1);
                if (pcVar18 == (char *)0x0) {
                  local_c8 = U_MEMORY_ALLOCATION_ERROR;
                  break;
                }
                u_UCharsToChars_63(pUVar10,pcVar18,local_b4);
                pcVar18[(int)local_b4] = '\0';
                icu_63::UVector::addElement(gKeyTypeStringPool,pcVar18,&local_c8);
                local_78 = pcVar18;
                if (U_ZERO_ERROR < local_c8) break;
              }
              local_54 = strcmp(local_98,"timezone");
              local_70 = uhash_open_63(uhash_hashIChars_63,uhash_compareIChars_63,(undefined1 *)0x0,
                                       &local_c8);
              if (U_ZERO_ERROR < local_c8) break;
              local_a0.ptr = (UResourceBundle *)0x0;
              local_a8.ptr = (UResourceBundle *)0x0;
              if (local_40.ptr != (UResourceBundle *)0x0) {
                local_c4 = U_ZERO_ERROR;
                pUVar9 = ures_getByKey_63(local_40.ptr,local_98,(UResourceBundle *)0x0,&local_c4);
                if (local_a0.ptr != (UResourceBundle *)0x0) {
                  ures_close_63(local_a0.ptr);
                }
                local_a0.ptr = pUVar9;
                if (U_ZERO_ERROR < local_c4) {
                  local_a0.ptr = (UResourceBundle *)0x0;
                }
              }
              if (local_48.super_LocalPointerBase<UResourceBundle>.ptr != (UResourceBundle *)0x0) {
                local_c4 = U_ZERO_ERROR;
                pUVar9 = ures_getByKey_63((UResourceBundle *)
                                          local_48.super_LocalPointerBase<UResourceBundle>.ptr,
                                          local_78,(UResourceBundle *)0x0,&local_c4);
                if (local_a8.ptr != (UResourceBundle *)0x0) {
                  ures_close_63(local_a8.ptr);
                }
                local_a8.ptr = pUVar9;
                if (U_ZERO_ERROR < local_c4) {
                  local_a8.ptr = (UResourceBundle *)0x0;
                }
              }
              local_c4 = U_ZERO_ERROR;
              local_68.ptr = ures_getByKey_63(local_38.ptr,local_98,(UResourceBundle *)0x0,&local_c4
                                             );
              uVar7 = 0;
              if (local_c4 < U_ILLEGAL_ARGUMENT_ERROR) {
                local_90.ptr = (UResourceBundle *)0x0;
                local_b0 = 0;
                while (UVar4 = ures_hasNext_63(local_68.ptr), LVar3.ptr = local_90.ptr,
                      UVar4 != '\0') {
                  local_90.ptr = (UResourceBundle *)0x0;
                  pUVar9 = ures_getNextResource_63(local_68.ptr,LVar3.ptr,&local_c8);
                  if (local_90.ptr != (UResourceBundle *)0x0) {
                    ures_close_63(local_90.ptr);
                  }
                  local_90.ptr = pUVar9;
                  if (U_ZERO_ERROR < local_c8) break;
                  pcVar18 = ures_getKey_63(pUVar9);
                  iVar5 = strcmp(pcVar18,"CODEPOINTS");
                  if (iVar5 == 0) {
                    uVar7 = 1;
LAB_002d51ae:
                    local_b0 = local_b0 | uVar7;
                  }
                  else {
                    iVar5 = strcmp(pcVar18,"REORDER_CODE");
                    if (iVar5 == 0) {
                      uVar7 = 2;
                      goto LAB_002d51ae;
                    }
                    iVar5 = strcmp(pcVar18,"RG_KEY_VALUE");
                    if (iVar5 == 0) {
                      uVar7 = 4;
                      goto LAB_002d51ae;
                    }
                    if ((local_54 == 0) && (pcVar11 = strchr(pcVar18,0x3a), pcVar11 != (char *)0x0))
                    {
                      sVar14 = strlen(pcVar18);
                      pcVar11 = (char *)uprv_malloc_63((long)((sVar14 << 0x20) + 0x100000000) >>
                                                       0x20);
                      if (pcVar11 == (char *)0x0) {
LAB_002d51c9:
                        local_c8 = U_MEMORY_ALLOCATION_ERROR;
                      }
                      else {
                        lVar15 = 0;
                        while( true ) {
                          cVar1 = pcVar18[lVar15];
                          cVar17 = '/';
                          if ((cVar1 != ':') && (cVar17 = cVar1, cVar1 == '\0')) break;
                          pcVar11[lVar15] = cVar17;
                          lVar15 = lVar15 + 1;
                        }
                        pcVar11[lVar15] = '\0';
                        icu_63::UVector::addElement(gKeyTypeStringPool,pcVar11,&local_c8);
                        pcVar18 = pcVar11;
                        if (local_c8 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002d4e66;
                      }
                      break;
                    }
LAB_002d4e66:
                    local_ac = 0;
                    pUVar10 = ures_getString_63(local_90.ptr,(int32_t *)&local_ac,&local_c8);
                    if (U_ZERO_ERROR < local_c8) break;
                    pcVar11 = pcVar18;
                    if (0 < (int)local_ac) {
                      pcVar11 = (char *)uprv_malloc_63((ulong)local_ac + 1);
                      if (pcVar11 == (char *)0x0) goto LAB_002d51c9;
                      u_UCharsToChars_63(pUVar10,pcVar11,local_ac);
                      pcVar11[(int)local_ac] = '\0';
                      icu_63::UVector::addElement(gKeyTypeStringPool,pcVar11,&local_c8);
                      if (U_ZERO_ERROR < local_c8) break;
                    }
                    puVar12 = (undefined8 *)uprv_malloc_63(0x10);
                    if (puVar12 == (undefined8 *)0x0) goto LAB_002d51c9;
                    puVar12[1] = pcVar11;
                    *puVar12 = pcVar18;
                    icu_63::UVector::addElement(gLocExtTypeEntries,puVar12,&local_c8);
                    if (U_ZERO_ERROR < local_c8) break;
                    uhash_put_63(local_70,pcVar18,puVar12,&local_c8);
                    if (pcVar11 != pcVar18) {
                      uhash_put_63(local_70,pcVar11,puVar12,&local_c8);
                    }
                    if (U_ZERO_ERROR < local_c8) break;
                    if (local_a0.ptr != (UResourceBundle *)0x0) {
                      local_c0.ptr = (UResourceBundle *)0x0;
                      ures_resetIterator_63(local_a0.ptr);
LAB_002d4f6b:
                      UVar4 = ures_hasNext_63(local_a0.ptr);
                      LVar3.ptr = local_c0.ptr;
                      UVar2 = local_c8;
                      if ((UVar4 != '\0') && (local_c8 < U_ILLEGAL_ARGUMENT_ERROR)) {
                        local_c0.ptr = (UResourceBundle *)0x0;
                        pUVar9 = ures_getNextResource_63(local_a0.ptr,LVar3.ptr,&local_c8);
                        if (local_c0.ptr != (UResourceBundle *)0x0) {
                          ures_close_63(local_c0.ptr);
                        }
                        local_c0.ptr = pUVar9;
                        pUVar10 = ures_getString_63(pUVar9,&local_7c,&local_c8);
                        if (local_c8 < U_ILLEGAL_ARGUMENT_ERROR) goto code_r0x002d4fd6;
                        goto LAB_002d51d9;
                      }
                      icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                                ((LocalUResourceBundlePointer *)&local_c0);
                      if (U_ZERO_ERROR < UVar2) break;
                    }
                    if (local_a8.ptr != (UResourceBundle *)0x0) {
                      local_c0.ptr = (UResourceBundle *)0x0;
                      ures_resetIterator_63(local_a8.ptr);
                      while ((UVar4 = ures_hasNext_63(local_a8.ptr), LVar3.ptr = local_c0.ptr,
                             UVar2 = local_c8, UVar4 != '\0' &&
                             (local_c8 < U_ILLEGAL_ARGUMENT_ERROR))) {
                        local_c0.ptr = (UResourceBundle *)0x0;
                        pUVar9 = ures_getNextResource_63(local_a8.ptr,LVar3.ptr,&local_c8);
                        if (local_c0.ptr != (UResourceBundle *)0x0) {
                          ures_close_63(local_c0.ptr);
                        }
                        local_c0.ptr = pUVar9;
                        pUVar10 = ures_getString_63(pUVar9,&local_7c,&local_c8);
                        if (U_ZERO_ERROR < local_c8) {
                          icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                                    ((LocalUResourceBundlePointer *)&local_c0);
                          goto LAB_002d51e8;
                        }
                        iVar6 = uprv_compareInvAscii_63
                                          ((UDataSwapper *)0x0,pcVar11,-1,pUVar10,local_7c);
                        if (iVar6 == 0) {
                          pcVar18 = ures_getKey_63(local_c0.ptr);
                          uhash_put_63(local_70,pcVar18,puVar12,&local_c8);
                        }
                      }
                      icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                                ((LocalUResourceBundlePointer *)&local_c0);
                      if (U_ZERO_ERROR < UVar2) break;
                    }
                  }
                }
LAB_002d51e8:
                icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                          ((LocalUResourceBundlePointer *)&local_90);
                uVar7 = local_b0;
              }
              if (U_ZERO_ERROR < local_c8) {
LAB_002d536f:
                icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                          ((LocalUResourceBundlePointer *)&local_68);
                icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                          ((LocalUResourceBundlePointer *)&local_a8);
                icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                          ((LocalUResourceBundlePointer *)&local_a0);
                break;
              }
              puVar12 = (undefined8 *)uprv_malloc_63(0x20);
              if (puVar12 == (undefined8 *)0x0) {
                local_c8 = U_MEMORY_ALLOCATION_ERROR;
                goto LAB_002d536f;
              }
              puVar12[1] = local_78;
              *puVar12 = local_98;
              *(uint *)(puVar12 + 3) = uVar7;
              puVar12[2] = local_70;
              icu_63::UVector::addElement(gLocExtKeyDataEntries,puVar12,&local_c8);
              if (U_ZERO_ERROR < local_c8) goto LAB_002d536f;
              uhash_put_63(gLocExtKeyMap,local_98,puVar12,&local_c8);
              if (local_98 != local_78) {
                uhash_put_63(gLocExtKeyMap,local_78,puVar12,&local_c8);
              }
              UVar2 = local_c8;
              icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                        ((LocalUResourceBundlePointer *)&local_68);
              icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                        ((LocalUResourceBundlePointer *)&local_a8);
              icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                        ((LocalUResourceBundlePointer *)&local_a0);
            } while (UVar2 < U_ILLEGAL_ARGUMENT_ERROR);
            icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                      ((LocalUResourceBundlePointer *)&local_88);
          }
        }
      }
    }
    icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_48);
    icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_40);
  }
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_38);
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_50);
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_60);
  gLocExtKeyMapInitOnce.fErrCode = local_c8;
  icu_63::umtx_initImplPostInit(&gLocExtKeyMapInitOnce);
  uVar16 = extraout_RAX;
LAB_002d532f:
  return (int)CONCAT71((int7)(uVar16 >> 8),local_c8 < U_ILLEGAL_ARGUMENT_ERROR);
code_r0x002d4fd6:
  iVar6 = uprv_compareInvAscii_63((UDataSwapper *)0x0,pcVar18,-1,pUVar10,local_7c);
  if (iVar6 != 0) goto LAB_002d4f6b;
  __s = ures_getKey_63(local_c0.ptr);
  if ((local_54 == 0) && (pcVar13 = strchr(__s,0x3a), pcVar13 != (char *)0x0)) {
    sVar14 = strlen(__s);
    pcVar13 = (char *)uprv_malloc_63((long)((sVar14 << 0x20) + 0x100000000) >> 0x20);
    if (pcVar13 == (char *)0x0) {
      local_c8 = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      lVar15 = 0;
      while( true ) {
        cVar1 = __s[lVar15];
        cVar17 = '/';
        if ((cVar1 != ':') && (cVar17 = cVar1, cVar1 == '\0')) break;
        pcVar13[lVar15] = cVar17;
        lVar15 = lVar15 + 1;
      }
      pcVar13[lVar15] = '\0';
      icu_63::UVector::addElement(gKeyTypeStringPool,pcVar13,&local_c8);
      __s = pcVar13;
      if (local_c8 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002d5092;
    }
LAB_002d51d9:
    icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_c0);
    goto LAB_002d51e8;
  }
LAB_002d5092:
  uhash_put_63(local_70,__s,puVar12,&local_c8);
  goto LAB_002d4f6b;
}

Assistant:

static UBool
init() {
    UErrorCode sts = U_ZERO_ERROR;
    umtx_initOnce(gLocExtKeyMapInitOnce, &initFromResourceBundle, sts);
    if (U_FAILURE(sts)) {
        return FALSE;
    }
    return TRUE;
}